

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

PrimMeta * __thiscall tinyusdz::Prim::metas(Prim *this)

{
  Model *pMVar1;
  Scope *pSVar2;
  Xform *pXVar3;
  GeomMesh *pGVar4;
  GPrim *pGVar5;
  GeomPoints *pGVar6;
  GeomCube *pGVar7;
  GeomCapsule *pGVar8;
  GeomCylinder *pGVar9;
  GeomSphere *pGVar10;
  GeomCone *pGVar11;
  GeomSubset *pGVar12;
  GeomCamera *pGVar13;
  GeomBasisCurves *pGVar14;
  DomeLight *pDVar15;
  SphereLight *pSVar16;
  RectLight *pRVar17;
  CylinderLight *pCVar18;
  DiskLight *pDVar19;
  Material *pMVar20;
  Shader *pSVar21;
  SkelRoot *pSVar22;
  Skeleton *pSVar23;
  SkelAnimation *pSVar24;
  BlendShape *pBVar25;
  PrimMeta *pPVar26;
  Value *this_00;
  
  this_00 = &this->_data;
  pMVar1 = tinyusdz::value::Value::as<tinyusdz::Model>(this_00,false);
  if (pMVar1 == (Model *)0x0) {
    pSVar2 = tinyusdz::value::Value::as<tinyusdz::Scope>(this_00,false);
    if (pSVar2 == (Scope *)0x0) {
      pXVar3 = tinyusdz::value::Value::as<tinyusdz::Xform>(this_00,false);
      if (pXVar3 == (Xform *)0x0) {
        pGVar5 = tinyusdz::value::Value::as<tinyusdz::GPrim>(this_00,false);
        if (pGVar5 == (GPrim *)0x0) {
          pGVar4 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(this_00,false);
          if (pGVar4 == (GeomMesh *)0x0) {
            pGVar6 = tinyusdz::value::Value::as<tinyusdz::GeomPoints>(this_00,false);
            if (pGVar6 == (GeomPoints *)0x0) {
              pGVar7 = tinyusdz::value::Value::as<tinyusdz::GeomCube>(this_00,false);
              if (pGVar7 == (GeomCube *)0x0) {
                pGVar8 = tinyusdz::value::Value::as<tinyusdz::GeomCapsule>(this_00,false);
                if (pGVar8 == (GeomCapsule *)0x0) {
                  pGVar9 = tinyusdz::value::Value::as<tinyusdz::GeomCylinder>(this_00,false);
                  if (pGVar9 == (GeomCylinder *)0x0) {
                    pGVar10 = tinyusdz::value::Value::as<tinyusdz::GeomSphere>(this_00,false);
                    if (pGVar10 == (GeomSphere *)0x0) {
                      pGVar11 = tinyusdz::value::Value::as<tinyusdz::GeomCone>(this_00,false);
                      if (pGVar11 == (GeomCone *)0x0) {
                        pGVar12 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(this_00,false);
                        if (pGVar12 != (GeomSubset *)0x0) {
                          pGVar12 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(this_00,false);
                          return &pGVar12->meta;
                        }
                        pGVar13 = tinyusdz::value::Value::as<tinyusdz::GeomCamera>(this_00,false);
                        if (pGVar13 == (GeomCamera *)0x0) {
                          pGVar14 = tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>
                                              (this_00,false);
                          if (pGVar14 == (GeomBasisCurves *)0x0) {
                            pDVar15 = tinyusdz::value::Value::as<tinyusdz::DomeLight>(this_00,false)
                            ;
                            if (pDVar15 != (DomeLight *)0x0) {
                              pDVar15 = tinyusdz::value::Value::as<tinyusdz::DomeLight>
                                                  (this_00,false);
                              return &(pDVar15->super_NonboundableLight).meta;
                            }
                            pSVar16 = tinyusdz::value::Value::as<tinyusdz::SphereLight>
                                                (this_00,false);
                            if (pSVar16 == (SphereLight *)0x0) {
                              pCVar18 = tinyusdz::value::Value::as<tinyusdz::CylinderLight>
                                                  (this_00,false);
                              if (pCVar18 == (CylinderLight *)0x0) {
                                pDVar19 = tinyusdz::value::Value::as<tinyusdz::DiskLight>
                                                    (this_00,false);
                                if (pDVar19 == (DiskLight *)0x0) {
                                  pRVar17 = tinyusdz::value::Value::as<tinyusdz::RectLight>
                                                      (this_00,false);
                                  if (pRVar17 == (RectLight *)0x0) {
                                    pMVar20 = tinyusdz::value::Value::as<tinyusdz::Material>
                                                        (this_00,false);
                                    if (pMVar20 == (Material *)0x0) {
                                      pSVar21 = tinyusdz::value::Value::as<tinyusdz::Shader>
                                                          (this_00,false);
                                      if (pSVar21 == (Shader *)0x0) {
                                        pSVar22 = tinyusdz::value::Value::as<tinyusdz::SkelRoot>
                                                            (this_00,false);
                                        if (pSVar22 != (SkelRoot *)0x0) {
                                          pSVar22 = tinyusdz::value::Value::as<tinyusdz::SkelRoot>
                                                              (this_00,false);
                                          return &pSVar22->meta;
                                        }
                                        pSVar23 = tinyusdz::value::Value::as<tinyusdz::Skeleton>
                                                            (this_00,false);
                                        if (pSVar23 != (Skeleton *)0x0) {
                                          pSVar23 = tinyusdz::value::Value::as<tinyusdz::Skeleton>
                                                              (this_00,false);
                                          return &pSVar23->meta;
                                        }
                                        pSVar24 = tinyusdz::value::Value::
                                                  as<tinyusdz::SkelAnimation>(this_00,false);
                                        if (pSVar24 != (SkelAnimation *)0x0) {
                                          pSVar24 = tinyusdz::value::Value::
                                                    as<tinyusdz::SkelAnimation>(this_00,false);
                                          return &pSVar24->meta;
                                        }
                                        pBVar25 = tinyusdz::value::Value::as<tinyusdz::BlendShape>
                                                            (this_00,false);
                                        if (pBVar25 != (BlendShape *)0x0) {
                                          pBVar25 = tinyusdz::value::Value::as<tinyusdz::BlendShape>
                                                              (this_00,false);
                                          return &pBVar25->meta;
                                        }
                                        pPVar26 = EmptyStaticMeta::GetEmptyStaticMeta();
                                        return pPVar26;
                                      }
                                      pMVar20 = (Material *)
                                                tinyusdz::value::Value::as<tinyusdz::Shader>
                                                          (this_00,false);
                                    }
                                    else {
                                      pMVar20 = tinyusdz::value::Value::as<tinyusdz::Material>
                                                          (this_00,false);
                                    }
                                    return &(pMVar20->super_UsdShadePrim).meta;
                                  }
                                  pRVar17 = tinyusdz::value::Value::as<tinyusdz::RectLight>
                                                      (this_00,false);
                                }
                                else {
                                  pRVar17 = (RectLight *)
                                            tinyusdz::value::Value::as<tinyusdz::DiskLight>
                                                      (this_00,false);
                                }
                              }
                              else {
                                pRVar17 = (RectLight *)
                                          tinyusdz::value::Value::as<tinyusdz::CylinderLight>
                                                    (this_00,false);
                              }
                            }
                            else {
                              pRVar17 = (RectLight *)
                                        tinyusdz::value::Value::as<tinyusdz::SphereLight>
                                                  (this_00,false);
                            }
                            return &(pRVar17->super_BoundableLight).meta;
                          }
                          pGVar4 = (GeomMesh *)
                                   tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>
                                             (this_00,false);
                        }
                        else {
                          pGVar4 = (GeomMesh *)
                                   tinyusdz::value::Value::as<tinyusdz::GeomCamera>(this_00,false);
                        }
                      }
                      else {
                        pGVar4 = (GeomMesh *)
                                 tinyusdz::value::Value::as<tinyusdz::GeomCone>(this_00,false);
                      }
                    }
                    else {
                      pGVar4 = (GeomMesh *)
                               tinyusdz::value::Value::as<tinyusdz::GeomSphere>(this_00,false);
                    }
                  }
                  else {
                    pGVar4 = (GeomMesh *)
                             tinyusdz::value::Value::as<tinyusdz::GeomCylinder>(this_00,false);
                  }
                }
                else {
                  pGVar4 = (GeomMesh *)
                           tinyusdz::value::Value::as<tinyusdz::GeomCapsule>(this_00,false);
                }
              }
              else {
                pGVar4 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomCube>(this_00,false);
              }
            }
            else {
              pGVar4 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GeomPoints>(this_00,false);
            }
          }
          else {
            pGVar4 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(this_00,false);
          }
        }
        else {
          pGVar4 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::GPrim>(this_00,false);
        }
      }
      else {
        pGVar4 = (GeomMesh *)tinyusdz::value::Value::as<tinyusdz::Xform>(this_00,false);
      }
      pPVar26 = &(pGVar4->super_GPrim).meta;
    }
    else {
      pSVar2 = tinyusdz::value::Value::as<tinyusdz::Scope>(this_00,false);
      pPVar26 = &pSVar2->meta;
    }
  }
  else {
    pMVar1 = tinyusdz::value::Value::as<tinyusdz::Model>(this_00,false);
    pPVar26 = &pMVar1->meta;
  }
  return pPVar26;
}

Assistant:

const PrimMeta &Prim::metas() const {
  const PrimMeta *p = GetPrimMeta(_data);
  if (p) {
    return *p;
  }

  // TODO: This should not happen. report an error.
  return EmptyStaticMeta::GetEmptyStaticMeta();
}